

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

FDecalAnimator * __thiscall FDecalLib::FindAnimator(FDecalLib *this,char *name)

{
  int iVar1;
  FDecalAnimator **ppFVar2;
  char *__s2;
  uint local_24;
  int i;
  char *name_local;
  FDecalLib *this_local;
  
  local_24 = TArray<FDecalAnimator_*,_FDecalAnimator_*>::Size
                       (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>);
  do {
    local_24 = local_24 - 1;
    if ((int)local_24 < 0) {
      return (FDecalAnimator *)0x0;
    }
    ppFVar2 = TArray<FDecalAnimator_*,_FDecalAnimator_*>::operator[]
                        (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>,
                         (long)(int)local_24);
    __s2 = FName::operator_cast_to_char_(&(*ppFVar2)->Name);
    iVar1 = strcasecmp(name,__s2);
  } while (iVar1 != 0);
  ppFVar2 = TArray<FDecalAnimator_*,_FDecalAnimator_*>::operator[]
                      (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>,
                       (long)(int)local_24);
  return *ppFVar2;
}

Assistant:

FDecalAnimator *FDecalLib::FindAnimator (const char *name)
{
	int i;

	for (i = (int)Animators.Size ()-1; i >= 0; --i)
	{
		if (stricmp (name, Animators[i]->Name) == 0)
		{
			return Animators[i];
		}
	}
	return NULL;
}